

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

HivePartitioningIndex * duckdb::HivePartitioningIndex::Deserialize(Deserializer *deserializer)

{
  HivePartitioningIndex *this;
  HivePartitioningIndex *in_RDI;
  unsigned_long index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  HivePartitioningIndex *result;
  HivePartitioningIndex *value_p;
  undefined8 in_stack_ffffffffffffff90;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc8;
  string local_30 [6];
  field_id_t in_stack_ffffffffffffffd6;
  Deserializer *in_stack_ffffffffffffffd8;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff90 >> 0x30);
  value_p = in_RDI;
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6,in_stack_ffffffffffffffc8);
  this = (HivePartitioningIndex *)
         Deserializer::ReadPropertyWithDefault<unsigned_long>
                   (in_stack_ffffffffffffff98,field_id,(char *)value_p);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff98,local_30);
  HivePartitioningIndex(this,&value_p->value,(idx_t)in_RDI);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  ::std::__cxx11::string::~string(local_30);
  return value_p;
}

Assistant:

HivePartitioningIndex HivePartitioningIndex::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadPropertyWithDefault<string>(100, "value");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(101, "index");
	HivePartitioningIndex result(std::move(value), index);
	return result;
}